

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::QToolButton(QToolButton *this,QWidget *parent)

{
  EVP_PKEY_CTX *ctx;
  QToolButtonPrivate *pQVar1;
  QWidget *in_RSI;
  QToolButtonPrivate *in_RDI;
  QAbstractButton *unaff_retaddr;
  QToolButtonPrivate *d;
  
  pQVar1 = in_RDI;
  ctx = (EVP_PKEY_CTX *)operator_new(0x310);
  QToolButtonPrivate::QToolButtonPrivate(in_RDI);
  QAbstractButton::QAbstractButton(unaff_retaddr,&pQVar1->super_QAbstractButtonPrivate,in_RSI);
  *(undefined ***)&(in_RDI->super_QAbstractButtonPrivate).super_QWidgetPrivate =
       &PTR_metaObject_00d1fba0;
  *(undefined ***)&(in_RDI->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x10 =
       &PTR__QToolButton_00d1fd70;
  pQVar1 = d_func((QToolButton *)0x708bee);
  QToolButtonPrivate::init(pQVar1,ctx);
  return;
}

Assistant:

QToolButton::QToolButton(QWidget * parent)
    : QAbstractButton(*new QToolButtonPrivate, parent)
{
    Q_D(QToolButton);
    d->init();
}